

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

void __thiscall
CLI::ArgumentMismatch::ArgumentMismatch
          (ArgumentMismatch *this,string *name,int expected,size_t recieved)

{
  size_type *psVar1;
  bool bVar2;
  uint uVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  uint uVar7;
  long *plVar8;
  ulong *puVar9;
  size_t sVar10;
  ulong uVar11;
  uint uVar12;
  char cVar13;
  ulong uVar14;
  uint uVar15;
  string __str;
  ulong *local_118;
  uint local_110;
  undefined4 uStack_10c;
  ulong local_108 [2];
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  long lStack_e0;
  string local_d8;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  char *local_58 [2];
  char local_48 [16];
  ArgumentMismatch *local_38;
  
  if (expected < 1) {
    uVar12 = -expected;
    if (0 < expected) {
      uVar12 = expected;
    }
    uVar15 = 1;
    if (9 < uVar12) {
      uVar11 = (ulong)uVar12;
      uVar3 = 4;
      do {
        uVar15 = uVar3;
        uVar7 = (uint)uVar11;
        if (uVar7 < 100) {
          uVar15 = uVar15 - 2;
          goto LAB_00147ce2;
        }
        if (uVar7 < 1000) {
          uVar15 = uVar15 - 1;
          goto LAB_00147ce2;
        }
        if (uVar7 < 10000) goto LAB_00147ce2;
        uVar11 = uVar11 / 10000;
        uVar3 = uVar15 + 4;
      } while (99999 < uVar7);
      uVar15 = uVar15 + 1;
    }
LAB_00147ce2:
    local_58[0] = local_48;
    local_38 = this;
    ::std::__cxx11::string::_M_construct((ulong)local_58,(char)uVar15);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_58[0],uVar15,uVar12);
    puVar6 = (undefined8 *)::std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x15bbb7);
    local_b8 = &local_a8;
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_a8 = *plVar5;
      lStack_a0 = puVar6[3];
    }
    else {
      local_a8 = *plVar5;
      local_b8 = (long *)*puVar6;
    }
    local_b0 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)::std::__cxx11::string::append((char *)&local_b8);
    local_98 = &local_88;
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_88 = *plVar5;
      lStack_80 = puVar6[3];
    }
    else {
      local_88 = *plVar5;
      local_98 = (long *)*puVar6;
    }
    local_90 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)
             ::std::__cxx11::string::_M_append((char *)&local_98,(ulong)(name->_M_dataplus)._M_p);
    local_78 = &local_68;
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_68 = *plVar5;
      lStack_60 = puVar6[3];
    }
    else {
      local_68 = *plVar5;
      local_78 = (long *)*puVar6;
    }
    local_70 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)::std::__cxx11::string::append((char *)&local_78);
    puVar9 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar9) {
      local_e8 = *puVar9;
      lStack_e0 = puVar6[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *puVar9;
      local_f8 = (ulong *)*puVar6;
    }
    local_f0 = puVar6[1];
    *puVar6 = puVar9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    cVar13 = '\x01';
    if (9 < recieved) {
      sVar10 = recieved;
      cVar4 = '\x04';
      do {
        cVar13 = cVar4;
        if (sVar10 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_00147ef8;
        }
        if (sVar10 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_00147ef8;
        }
        if (sVar10 < 10000) goto LAB_00147ef8;
        bVar2 = 99999 < sVar10;
        sVar10 = sVar10 / 10000;
        cVar4 = cVar13 + '\x04';
      } while (bVar2);
      cVar13 = cVar13 + '\x01';
    }
LAB_00147ef8:
    local_118 = local_108;
    ::std::__cxx11::string::_M_construct((ulong)&local_118,cVar13);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_118,local_110,recieved);
    this = local_38;
    uVar11 = CONCAT44(uStack_10c,local_110) + local_f0;
    uVar14 = 0xf;
    if (local_f8 != &local_e8) {
      uVar14 = local_e8;
    }
    if (uVar14 < uVar11) {
      uVar14 = 0xf;
      if (local_118 != local_108) {
        uVar14 = local_108[0];
      }
      if (uVar11 <= uVar14) {
        puVar6 = (undefined8 *)
                 ::std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_f8);
        goto LAB_00147f85;
      }
    }
    puVar6 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_118);
  }
  else {
    uVar12 = 1;
    if (9 < (uint)expected) {
      uVar15 = expected;
      uVar3 = 4;
      do {
        uVar12 = uVar3;
        if (uVar15 < 100) {
          uVar12 = uVar12 - 2;
          goto LAB_00147a3e;
        }
        if (uVar15 < 1000) {
          uVar12 = uVar12 - 1;
          goto LAB_00147a3e;
        }
        if (uVar15 < 10000) goto LAB_00147a3e;
        bVar2 = 99999 < uVar15;
        uVar15 = uVar15 / 10000;
        uVar3 = uVar12 + 4;
      } while (bVar2);
      uVar12 = uVar12 + 1;
    }
LAB_00147a3e:
    local_58[0] = local_48;
    ::std::__cxx11::string::_M_construct((ulong)local_58,(char)uVar12);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_58[0],uVar12,expected);
    plVar5 = (long *)::std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x15bb8f);
    local_b8 = &local_a8;
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_a8 = *plVar8;
      lStack_a0 = plVar5[3];
    }
    else {
      local_a8 = *plVar8;
      local_b8 = (long *)*plVar5;
    }
    local_b0 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_b8);
    local_98 = &local_88;
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_88 = *plVar8;
      lStack_80 = plVar5[3];
    }
    else {
      local_88 = *plVar8;
      local_98 = (long *)*plVar5;
    }
    local_90 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_98,(ulong)(name->_M_dataplus)._M_p);
    local_78 = &local_68;
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_68 = *plVar8;
      lStack_60 = plVar5[3];
    }
    else {
      local_68 = *plVar8;
      local_78 = (long *)*plVar5;
    }
    local_70 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_78);
    puVar9 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar9) {
      local_e8 = *puVar9;
      lStack_e0 = plVar5[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *puVar9;
      local_f8 = (ulong *)*plVar5;
    }
    local_f0 = plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    cVar13 = '\x01';
    if (9 < recieved) {
      sVar10 = recieved;
      cVar4 = '\x04';
      do {
        cVar13 = cVar4;
        if (sVar10 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_00147c49;
        }
        if (sVar10 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_00147c49;
        }
        if (sVar10 < 10000) goto LAB_00147c49;
        bVar2 = 99999 < sVar10;
        sVar10 = sVar10 / 10000;
        cVar4 = cVar13 + '\x04';
      } while (bVar2);
      cVar13 = cVar13 + '\x01';
    }
LAB_00147c49:
    local_118 = local_108;
    ::std::__cxx11::string::_M_construct((ulong)&local_118,cVar13);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_118,local_110,recieved);
    uVar11 = CONCAT44(uStack_10c,local_110) + local_f0;
    uVar14 = 0xf;
    if (local_f8 != &local_e8) {
      uVar14 = local_e8;
    }
    if (uVar14 < uVar11) {
      uVar14 = 0xf;
      if (local_118 != local_108) {
        uVar14 = local_108[0];
      }
      if (uVar11 <= uVar14) {
        puVar6 = (undefined8 *)
                 ::std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_f8);
        goto LAB_00147f85;
      }
    }
    puVar6 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_118);
  }
LAB_00147f85:
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  psVar1 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_d8.field_2._M_allocated_capacity = *psVar1;
    local_d8.field_2._8_8_ = puVar6[3];
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar1;
    local_d8._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_d8._M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  ArgumentMismatch(this,&local_d8,ArgumentMismatch);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_118 != local_108) {
    operator_delete(local_118);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  return;
}

Assistant:

ArgumentMismatch(std::string name, int expected, size_t recieved)
        : ArgumentMismatch(expected > 0 ? ("Expected exactly " + std::to_string(expected) + " arguments to " + name +
                                           ", got " + std::to_string(recieved))
                                        : ("Expected at least " + std::to_string(-expected) + " arguments to " + name +
                                           ", got " + std::to_string(recieved)),
                           ExitCodes::ArgumentMismatch) {}